

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void find_coreGL(void)

{
  int iVar1;
  size_t __n;
  bool local_63;
  bool local_62;
  bool local_61;
  bool local_60;
  bool local_5f;
  bool local_5e;
  bool local_5d;
  bool local_5c;
  bool local_5b;
  bool local_5a;
  bool local_59;
  bool local_58;
  bool local_57;
  bool local_56;
  bool local_55;
  bool local_54;
  bool local_53;
  bool local_52;
  bool local_51;
  size_t length;
  char *prefixes [4];
  GLubyte *local_20;
  char *version;
  int local_10;
  int minor;
  int major;
  int i;
  
  prefixes[0] = "OpenGL ES-CL ";
  prefixes[1] = "OpenGL ES ";
  prefixes[2] = (char *)0x0;
  local_20 = (*glad_glGetString)(0x1f02);
  if (local_20 != (GLubyte *)0x0) {
    minor = 0;
    while (prefixes[(long)minor + -1] != (char *)0x0) {
      __n = strlen(prefixes[(long)minor + -1]);
      iVar1 = strncmp((char *)local_20,prefixes[(long)minor + -1],__n);
      if (iVar1 == 0) {
        local_20 = local_20 + __n;
        break;
      }
      minor = minor + 1;
    }
    __isoc99_sscanf(local_20,"%d.%d",&local_10,(long)&version + 4);
    GLVersion.major = local_10;
    GLVersion.minor = version._4_4_;
    max_loaded_major = local_10;
    max_loaded_minor = version._4_4_;
    if ((local_10 != 1) || (local_51 = true, version._4_4_ < 0)) {
      local_51 = 1 < local_10;
    }
    GLAD_GL_VERSION_1_0 = (int)local_51;
    if ((local_10 != 1) || (local_52 = true, version._4_4_ < 1)) {
      local_52 = 1 < local_10;
    }
    GLAD_GL_VERSION_1_1 = (int)local_52;
    if ((local_10 != 1) || (local_53 = true, version._4_4_ < 2)) {
      local_53 = 1 < local_10;
    }
    GLAD_GL_VERSION_1_2 = (int)local_53;
    if ((local_10 != 1) || (local_54 = true, version._4_4_ < 3)) {
      local_54 = 1 < local_10;
    }
    GLAD_GL_VERSION_1_3 = (int)local_54;
    if ((local_10 != 1) || (local_55 = true, version._4_4_ < 4)) {
      local_55 = 1 < local_10;
    }
    GLAD_GL_VERSION_1_4 = (int)local_55;
    if ((local_10 != 1) || (local_56 = true, version._4_4_ < 5)) {
      local_56 = 1 < local_10;
    }
    GLAD_GL_VERSION_1_5 = (int)local_56;
    if ((local_10 != 2) || (local_57 = true, version._4_4_ < 0)) {
      local_57 = 2 < local_10;
    }
    GLAD_GL_VERSION_2_0 = (int)local_57;
    if ((local_10 != 2) || (local_58 = true, version._4_4_ < 1)) {
      local_58 = 2 < local_10;
    }
    GLAD_GL_VERSION_2_1 = (int)local_58;
    if ((local_10 != 3) || (local_59 = true, version._4_4_ < 0)) {
      local_59 = 3 < local_10;
    }
    GLAD_GL_VERSION_3_0 = (int)local_59;
    if ((local_10 != 3) || (local_5a = true, version._4_4_ < 1)) {
      local_5a = 3 < local_10;
    }
    GLAD_GL_VERSION_3_1 = (int)local_5a;
    if ((local_10 != 3) || (local_5b = true, version._4_4_ < 2)) {
      local_5b = 3 < local_10;
    }
    GLAD_GL_VERSION_3_2 = (int)local_5b;
    if ((local_10 != 3) || (local_5c = true, version._4_4_ < 3)) {
      local_5c = 3 < local_10;
    }
    GLAD_GL_VERSION_3_3 = (int)local_5c;
    if ((local_10 != 4) || (local_5d = true, version._4_4_ < 0)) {
      local_5d = 4 < local_10;
    }
    GLAD_GL_VERSION_4_0 = (int)local_5d;
    if ((local_10 != 4) || (local_5e = true, version._4_4_ < 1)) {
      local_5e = 4 < local_10;
    }
    GLAD_GL_VERSION_4_1 = (int)local_5e;
    if ((local_10 != 4) || (local_5f = true, version._4_4_ < 2)) {
      local_5f = 4 < local_10;
    }
    GLAD_GL_VERSION_4_2 = (int)local_5f;
    if ((local_10 != 4) || (local_60 = true, version._4_4_ < 3)) {
      local_60 = 4 < local_10;
    }
    GLAD_GL_VERSION_4_3 = (int)local_60;
    if ((local_10 != 4) || (local_61 = true, version._4_4_ < 4)) {
      local_61 = 4 < local_10;
    }
    GLAD_GL_VERSION_4_4 = (int)local_61;
    if ((local_10 != 4) || (local_62 = true, version._4_4_ < 5)) {
      local_62 = 4 < local_10;
    }
    GLAD_GL_VERSION_4_5 = (int)local_62;
    if ((local_10 != 4) || (local_63 = true, version._4_4_ < 6)) {
      local_63 = 4 < local_10;
    }
    GLAD_GL_VERSION_4_6 = (int)local_63;
    if ((4 < local_10) || ((3 < local_10 && (5 < version._4_4_)))) {
      max_loaded_major = 4;
      max_loaded_minor = 6;
    }
  }
  return;
}

Assistant:

static void find_coreGL(void) {

    /* Thank you @elmindreda
     * https://github.com/elmindreda/greg/blob/master/templates/greg.c.in#L176
     * https://github.com/glfw/glfw/blob/master/src/context.c#L36
     */
    int i, major, minor;

    const char* version;
    const char* prefixes[] = {
        "OpenGL ES-CM ",
        "OpenGL ES-CL ",
        "OpenGL ES ",
        NULL
    };

    version = (const char*) glGetString(GL_VERSION);
    if (!version) return;

    for (i = 0;  prefixes[i];  i++) {
        const size_t length = strlen(prefixes[i]);
        if (strncmp(version, prefixes[i], length) == 0) {
            version += length;
            break;
        }
    }

/* PR #18 */
#ifdef _MSC_VER
    sscanf_s(version, "%d.%d", &major, &minor);
#else
    sscanf(version, "%d.%d", &major, &minor);
#endif

    GLVersion.major = major; GLVersion.minor = minor;
    max_loaded_major = major; max_loaded_minor = minor;
	GLAD_GL_VERSION_1_0 = (major == 1 && minor >= 0) || major > 1;
	GLAD_GL_VERSION_1_1 = (major == 1 && minor >= 1) || major > 1;
	GLAD_GL_VERSION_1_2 = (major == 1 && minor >= 2) || major > 1;
	GLAD_GL_VERSION_1_3 = (major == 1 && minor >= 3) || major > 1;
	GLAD_GL_VERSION_1_4 = (major == 1 && minor >= 4) || major > 1;
	GLAD_GL_VERSION_1_5 = (major == 1 && minor >= 5) || major > 1;
	GLAD_GL_VERSION_2_0 = (major == 2 && minor >= 0) || major > 2;
	GLAD_GL_VERSION_2_1 = (major == 2 && minor >= 1) || major > 2;
	GLAD_GL_VERSION_3_0 = (major == 3 && minor >= 0) || major > 3;
	GLAD_GL_VERSION_3_1 = (major == 3 && minor >= 1) || major > 3;
	GLAD_GL_VERSION_3_2 = (major == 3 && minor >= 2) || major > 3;
	GLAD_GL_VERSION_3_3 = (major == 3 && minor >= 3) || major > 3;
	GLAD_GL_VERSION_4_0 = (major == 4 && minor >= 0) || major > 4;
	GLAD_GL_VERSION_4_1 = (major == 4 && minor >= 1) || major > 4;
	GLAD_GL_VERSION_4_2 = (major == 4 && minor >= 2) || major > 4;
	GLAD_GL_VERSION_4_3 = (major == 4 && minor >= 3) || major > 4;
	GLAD_GL_VERSION_4_4 = (major == 4 && minor >= 4) || major > 4;
	GLAD_GL_VERSION_4_5 = (major == 4 && minor >= 5) || major > 4;
	GLAD_GL_VERSION_4_6 = (major == 4 && minor >= 6) || major > 4;
	if (GLVersion.major > 4 || (GLVersion.major >= 4 && GLVersion.minor >= 6)) {
		max_loaded_major = 4;
		max_loaded_minor = 6;
	}
}